

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyFraig.c
# Opt level: O1

int Ivy_FraigProve(Ivy_Man_t **ppManAig,void *pPars)

{
  int iVar1;
  sat_solver *psVar2;
  double dVar3;
  double dVar4;
  int iVar5;
  Ivy_Man_t *pMan;
  Ivy_FraigMan_t *p;
  long lVar6;
  void *__s;
  char *pcVar7;
  long lVar8;
  char *pcVar9;
  int iVar10;
  ABC_INT64_T AVar11;
  abctime aVar12;
  Ivy_Man_t *pIVar13;
  size_t __size;
  double dVar14;
  timespec ts;
  Ivy_FraigParams_t Params;
  timespec local_98;
  ABC_INT64_T local_88;
  Ivy_Man_t **local_80;
  Ivy_FraigParams_t local_78;
  
  pIVar13 = *ppManAig;
  local_78._60_4_ = 0;
  local_78.nSimWords = 0x20;
  local_78._4_4_ = 0;
  local_78.dSimSatur = 0.005;
  local_78.fPatScores = 0;
  local_78.MaxScore = 0x19;
  local_78.fDoSparse = 1;
  local_78.dActConeRatio = 0.3;
  local_78.dActConeBumpMax = 10.0;
  local_78.nBTLimitNode = 100;
  local_78.nBTLimitMiter = 500000;
  local_78.fVerbose = *(int *)((long)pPars + 0xc);
  local_78.fProve = 1;
  if (*(int *)((long)pPars + 0xc) != 0) {
    pcVar7 = "yes";
    pcVar9 = "yes";
    if (*(int *)((long)pPars + 4) == 0) {
      pcVar9 = "no";
    }
    if (*pPars == 0) {
      pcVar7 = "no";
    }
    printf("RESOURCE LIMITS: Iterations = %d. Rewriting = %s. Fraiging = %s.\n",
           (ulong)*(uint *)((long)pPars + 0x10),pcVar9,pcVar7);
    printf("Miter = %d (%3.1f).  Rwr = %d (%3.1f).  Fraig = %d (%3.1f).  Last = %d.\n",
           SUB84((double)*(float *)((long)pPars + 0x18),0),(double)*(float *)((long)pPars + 0x20),
           (double)*(float *)((long)pPars + 0x28),(ulong)*(uint *)((long)pPars + 0x14),
           (ulong)*(uint *)((long)pPars + 0x1c),(ulong)*(uint *)((long)pPars + 0x24),
           (ulong)*(uint *)((long)pPars + 0x34));
  }
  if ((*(int *)((long)pPars + 4) == 0) && (*pPars == 0)) {
    iVar5 = clock_gettime(3,&local_98);
    if (iVar5 < 0) {
      aVar12 = -1;
    }
    else {
      aVar12 = local_98.tv_nsec / 1000 + local_98.tv_sec * 1000000;
    }
    local_78.nBTLimitMiter = *(int *)((long)pPars + 0x34) / pIVar13->nObjs[2];
    pMan = Ivy_FraigMiter(pIVar13,&local_78);
    Ivy_ManStop(pIVar13);
    iVar5 = Ivy_FraigMiterStatus(pMan);
    Ivy_FraigMiterPrint(pMan,"SAT solving",aVar12,*(int *)((long)pPars + 0xc));
  }
  else {
    pMan = pIVar13;
    if (pIVar13->nObjs[6] + pIVar13->nObjs[5] < 500) {
      iVar5 = clock_gettime(3,&local_98);
      if (iVar5 < 0) {
        aVar12 = -1;
      }
      else {
        aVar12 = local_98.tv_nsec / 1000 + local_98.tv_sec * 1000000;
      }
      local_78.nBTLimitMiter = *(int *)((long)pPars + 0x14) / pIVar13->nObjs[2];
      pMan = Ivy_FraigMiter(pIVar13,&local_78);
      Ivy_ManStop(pIVar13);
      iVar5 = Ivy_FraigMiterStatus(pMan);
      Ivy_FraigMiterPrint(pMan,"SAT solving",aVar12,*(int *)((long)pPars + 0xc));
      if (-1 < iVar5) goto LAB_007e4bff;
    }
    local_80 = ppManAig;
    if (*(int *)((long)pPars + 0x10) < 1) {
      iVar5 = -1;
    }
    else {
      iVar10 = 0;
      AVar11 = 0;
      local_88 = 0;
      pIVar13 = pMan;
      do {
        dVar14 = (double)iVar10;
        if (*(int *)((long)pPars + 0xc) != 0) {
          iVar5 = *(int *)((long)pPars + 0x14);
          dVar3 = pow((double)*(float *)((long)pPars + 0x18),dVar14);
          iVar1 = *(int *)((long)pPars + 0x24);
          dVar4 = pow((double)*(float *)((long)pPars + 0x28),dVar14);
          printf("ITERATION %2d : Confs = %6d. FraigBTL = %3d. \n",(ulong)(iVar10 + 1),
                 (ulong)(uint)(int)(dVar3 * (double)iVar5),(ulong)(uint)(int)(dVar4 * (double)iVar1)
                );
          fflush(_stdout);
        }
        iVar5 = Ivy_FraigMiterStatus(pIVar13);
        pMan = pIVar13;
        if (-1 < iVar5) break;
        if (*pPars != 0) {
          iVar5 = clock_gettime(3,&local_98);
          if (iVar5 < 0) {
            aVar12 = -1;
          }
          else {
            aVar12 = local_98.tv_nsec / 1000 + local_98.tv_sec * 1000000;
          }
          iVar5 = *(int *)((long)pPars + 0x24);
          dVar3 = pow((double)*(float *)((long)pPars + 0x28),dVar14);
          local_78.nBTLimitNode = (int)(dVar3 * (double)iVar5);
          iVar5 = *(int *)((long)pPars + 0x14);
          dVar14 = pow((double)*(float *)((long)pPars + 0x18),dVar14);
          local_78.nBTLimitMiter = (int)(dVar14 * (double)iVar5) / pIVar13->nObjs[2] + 1;
          if (pIVar13->nObjs[6] + pIVar13->nObjs[5] == 0) {
            pMan = Ivy_ManDup(pIVar13);
          }
          else {
            AVar11 = *(ABC_INT64_T *)((long)pPars + 0x38);
            local_88 = *(ABC_INT64_T *)((long)pPars + 0x40);
            iVar5 = clock_gettime(3,&local_98);
            if (iVar5 < 0) {
              lVar6 = 1;
            }
            else {
              lVar6 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_98.tv_nsec),8);
              lVar6 = ((lVar6 >> 7) - (lVar6 >> 0x3f)) + local_98.tv_sec * -1000000;
            }
            if (pIVar13->nObjs[4] != 0) {
              __assert_fail("Ivy_ManLatchNum(pManAig) == 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyFraig.c"
                            ,0x1a6,
                            "Ivy_Man_t *Ivy_FraigPerform_int(Ivy_Man_t *, Ivy_FraigParams_t *, ABC_INT64_T, ABC_INT64_T, ABC_INT64_T *, ABC_INT64_T *)"
                           );
            }
            p = Ivy_FraigStart(pIVar13,&local_78);
            p->nBTLimitGlobal = AVar11;
            p->nInsLimitGlobal = local_88;
            Ivy_FraigSimulate(p);
            Ivy_FraigSweep(p);
            pMan = p->pManFraig;
            iVar5 = clock_gettime(3,&local_98);
            if (iVar5 < 0) {
              lVar8 = -1;
            }
            else {
              lVar8 = local_98.tv_nsec / 1000 + local_98.tv_sec * 1000000;
            }
            p->timeTotal = lVar8 + lVar6;
            psVar2 = p->pSat;
            if (psVar2 == (sat_solver *)0x0) {
              local_88 = 0;
              AVar11 = 0;
            }
            else {
              local_88 = (psVar2->stats).conflicts;
              AVar11 = (psVar2->stats).inspects;
            }
            Ivy_FraigStop(p);
          }
          Ivy_ManStop(pIVar13);
          iVar5 = Ivy_FraigMiterStatus(pMan);
          Ivy_FraigMiterPrint(pMan,"Fraiging   ",aVar12,*(int *)((long)pPars + 0xc));
        }
        if (-1 < iVar5) break;
        lVar8 = *(long *)((long)pPars + 0x48) + local_88;
        *(long *)((long)pPars + 0x48) = lVar8;
        lVar6 = *(long *)((long)pPars + 0x50) + AVar11;
        *(long *)((long)pPars + 0x50) = lVar6;
        if (((*(long *)((long)pPars + 0x38) != 0) && (*(long *)((long)pPars + 0x38) <= lVar8)) ||
           ((*(long *)((long)pPars + 0x40) != 0 && (*(long *)((long)pPars + 0x40) <= lVar6)))) {
          puts("Reached global limit on conflicts/inspects. Quitting.");
          iVar5 = -1;
          ppManAig = local_80;
          goto LAB_007e4bff;
        }
        iVar10 = iVar10 + 1;
        pIVar13 = pMan;
      } while (iVar10 < *(int *)((long)pPars + 0x10));
    }
    ppManAig = local_80;
    if ((iVar5 == 0) && (pMan->pData == (void *)0x0)) {
      __size = (long)pMan->nObjs[1] << 2;
      __s = malloc(__size);
      pMan->pData = __s;
      memset(__s,0,__size);
    }
  }
LAB_007e4bff:
  *ppManAig = pMan;
  return iVar5;
}

Assistant:

int Ivy_FraigProve( Ivy_Man_t ** ppManAig, void * pPars )
{
    Prove_Params_t * pParams = (Prove_Params_t *)pPars;
    Ivy_FraigParams_t Params, * pIvyParams = &Params; 
    Ivy_Man_t * pManAig, * pManTemp;
    int RetValue, nIter;
    abctime clk;//, Counter;
    ABC_INT64_T nSatConfs = 0, nSatInspects = 0;

    // start the network and parameters
    pManAig = *ppManAig;
    Ivy_FraigParamsDefault( pIvyParams );
    pIvyParams->fVerbose = pParams->fVerbose;
    pIvyParams->fProve = 1;

    if ( pParams->fVerbose )
    {
        printf( "RESOURCE LIMITS: Iterations = %d. Rewriting = %s. Fraiging = %s.\n",
            pParams->nItersMax, pParams->fUseRewriting? "yes":"no", pParams->fUseFraiging? "yes":"no" );
        printf( "Miter = %d (%3.1f).  Rwr = %d (%3.1f).  Fraig = %d (%3.1f).  Last = %d.\n", 
            pParams->nMiteringLimitStart,  pParams->nMiteringLimitMulti, 
            pParams->nRewritingLimitStart, pParams->nRewritingLimitMulti,
            pParams->nFraigingLimitStart,  pParams->nFraigingLimitMulti, pParams->nMiteringLimitLast );
    }

    // if SAT only, solve without iteration
    if ( !pParams->fUseRewriting && !pParams->fUseFraiging )
    {
        clk = Abc_Clock();
        pIvyParams->nBTLimitMiter = pParams->nMiteringLimitLast / Ivy_ManPoNum(pManAig);
        pManAig = Ivy_FraigMiter( pManTemp = pManAig, pIvyParams );  Ivy_ManStop( pManTemp );
        RetValue = Ivy_FraigMiterStatus( pManAig );
        Ivy_FraigMiterPrint( pManAig, "SAT solving", clk, pParams->fVerbose );
        *ppManAig = pManAig;
        return RetValue;
    }

    if ( Ivy_ManNodeNum(pManAig) < 500 )
    {
        // run the first mitering
        clk = Abc_Clock();
        pIvyParams->nBTLimitMiter = pParams->nMiteringLimitStart / Ivy_ManPoNum(pManAig);
        pManAig = Ivy_FraigMiter( pManTemp = pManAig, pIvyParams );  Ivy_ManStop( pManTemp );
        RetValue = Ivy_FraigMiterStatus( pManAig );
        Ivy_FraigMiterPrint( pManAig, "SAT solving", clk, pParams->fVerbose );
        if ( RetValue >= 0 )
        {
            *ppManAig = pManAig;
            return RetValue;
        }
    }

    // check the current resource limits
    RetValue = -1;
    for ( nIter = 0; nIter < pParams->nItersMax; nIter++ )
    {
        if ( pParams->fVerbose )
        {
            printf( "ITERATION %2d : Confs = %6d. FraigBTL = %3d. \n", nIter+1, 
                 (int)(pParams->nMiteringLimitStart * pow(pParams->nMiteringLimitMulti,nIter)), 
                 (int)(pParams->nFraigingLimitStart * pow(pParams->nFraigingLimitMulti,nIter)) );
            fflush( stdout );
        }

        // try rewriting
        if ( pParams->fUseRewriting )
        { // bug in Ivy_NodeFindCutsAll() when leaves are identical!
/*
            clk = Abc_Clock();
            Counter = (int)(pParams->nRewritingLimitStart * pow(pParams->nRewritingLimitMulti,nIter));
            pManAig = Ivy_ManRwsat( pManAig, 0 );  
            RetValue = Ivy_FraigMiterStatus( pManAig );
            Ivy_FraigMiterPrint( pManAig, "Rewriting  ", clk, pParams->fVerbose );
*/
        }
        if ( RetValue >= 0 )
            break;

        // catch the situation when ref pattern detects the bug
        RetValue = Ivy_FraigMiterStatus( pManAig );
        if ( RetValue >= 0 )
            break;

        // try fraiging followed by mitering
        if ( pParams->fUseFraiging )
        {
            clk = Abc_Clock();
            pIvyParams->nBTLimitNode  = (int)(pParams->nFraigingLimitStart * pow(pParams->nFraigingLimitMulti,nIter));
            pIvyParams->nBTLimitMiter = 1 + (int)(pParams->nMiteringLimitStart * pow(pParams->nMiteringLimitMulti,nIter)) / Ivy_ManPoNum(pManAig);
            pManAig = Ivy_FraigPerform_int( pManTemp = pManAig, pIvyParams, pParams->nTotalBacktrackLimit, pParams->nTotalInspectLimit, &nSatConfs, &nSatInspects );  Ivy_ManStop( pManTemp );
            RetValue = Ivy_FraigMiterStatus( pManAig );
            Ivy_FraigMiterPrint( pManAig, "Fraiging   ", clk, pParams->fVerbose );
        }
        if ( RetValue >= 0 )
            break;

        // add to the number of backtracks and inspects
        pParams->nTotalBacktracksMade += nSatConfs;
        pParams->nTotalInspectsMade   += nSatInspects;
        // check if global resource limit is reached
        if ( (pParams->nTotalBacktrackLimit && pParams->nTotalBacktracksMade >= pParams->nTotalBacktrackLimit) ||
             (pParams->nTotalInspectLimit   && pParams->nTotalInspectsMade   >= pParams->nTotalInspectLimit) )
        {
            printf( "Reached global limit on conflicts/inspects. Quitting.\n" );
            *ppManAig = pManAig;
            return -1;
        }
    }    
/*
    if ( RetValue < 0 )
    {
        if ( pParams->fVerbose )
        {
            printf( "Attempting SAT with conflict limit %d ...\n", pParams->nMiteringLimitLast );
            fflush( stdout );
        }
        clk = Abc_Clock();
        pIvyParams->nBTLimitMiter = pParams->nMiteringLimitLast / Ivy_ManPoNum(pManAig);
        if ( pParams->nTotalBacktrackLimit )
            s_nBTLimitGlobal  = pParams->nTotalBacktrackLimit - pParams->nTotalBacktracksMade;
        if ( pParams->nTotalInspectLimit )
            s_nInsLimitGlobal = pParams->nTotalInspectLimit -   pParams->nTotalInspectsMade;        
        pManAig = Ivy_FraigMiter( pManTemp = pManAig, pIvyParams );  Ivy_ManStop( pManTemp );
        s_nBTLimitGlobal  = 0;
        s_nInsLimitGlobal = 0;        
        RetValue = Ivy_FraigMiterStatus( pManAig );
        Ivy_FraigMiterPrint( pManAig, "SAT solving", clk, pParams->fVerbose );
        // make sure that the sover never returns "undecided" when infinite resource limits are set
        if( RetValue == -1 && pParams->nTotalInspectLimit == 0 &&
            pParams->nTotalBacktrackLimit == 0 )
        {
            extern void Prove_ParamsPrint( Prove_Params_t * pParams );
            Prove_ParamsPrint( pParams );
            printf("ERROR: ABC has returned \"undecided\" in spite of no limits...\n");
            exit(1);
        }
    }
*/
    // assign the model if it was proved by rewriting (const 1 miter)
    if ( RetValue == 0 && pManAig->pData == NULL )
    {
        pManAig->pData = ABC_ALLOC( int, Ivy_ManPiNum(pManAig) );
        memset( pManAig->pData, 0, sizeof(int) * Ivy_ManPiNum(pManAig) );
    }
    *ppManAig = pManAig;
    return RetValue;
}